

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O2

TRANSPORT_LL_HANDLE
IoTHubTransportHttp_Create
          (IOTHUBTRANSPORT_CONFIG *config,TRANSPORT_CALLBACKS_INFO *cb_info,void *ctx)

{
  IOTHUB_CLIENT_CONFIG *pIVar1;
  int iVar2;
  HTTPAPIEX_RESULT HVar3;
  LOGGER_LOG p_Var4;
  HTTPTRANSPORT_HANDLE_DATA *handleData;
  STRING_HANDLE handle;
  HTTPAPIEX_HANDLE pHVar5;
  VECTOR_HANDLE pVVar6;
  long lVar7;
  TRANSPORT_CALLBACKS_INFO *pTVar8;
  char *pcVar9;
  byte bVar10;
  
  bVar10 = 0;
  if (config == (IOTHUBTRANSPORT_CONFIG *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar9 = "invalid arg (configuration is missing)";
    iVar2 = 0x3be;
LAB_0012952f:
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
              ,"IoTHubTransportHttp_Create",iVar2,1,pcVar9);
    return (TRANSPORT_LL_HANDLE)0x0;
  }
  pIVar1 = config->upperConfig;
  if (pIVar1 == (IOTHUB_CLIENT_CONFIG *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar9 = "invalid arg (upperConfig is NULL)";
    iVar2 = 0x3c3;
    goto LAB_0012952f;
  }
  if (pIVar1->protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar9 = "invalid arg (protocol is NULL)";
    iVar2 = 0x3c8;
    goto LAB_0012952f;
  }
  if (pIVar1->iotHubName == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar9 = "invalid arg (iotHubName is NULL)";
    iVar2 = 0x3cd;
    goto LAB_0012952f;
  }
  if (pIVar1->iotHubSuffix == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar9 = "invalid arg (iotHubSuffix is NULL)";
    iVar2 = 0x3d2;
    goto LAB_0012952f;
  }
  iVar2 = IoTHub_Transport_ValidateCallbacks(cb_info);
  if (iVar2 != 0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar9 = "Invalid transport callback information";
    iVar2 = 0x3d7;
    goto LAB_0012952f;
  }
  handleData = (HTTPTRANSPORT_HANDLE_DATA *)malloc(0x70);
  if (handleData == (HTTPTRANSPORT_HANDLE_DATA *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar9 = "unable to malloc";
    iVar2 = 0x3df;
    goto LAB_0012952f;
  }
  HVar3 = HTTPAPIEX_Init();
  if (HVar3 == HTTPAPIEX_ERROR) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"IoTHubTransportHttp_Create",0x3e3,1,"Error initializing HTTP");
    }
    goto LAB_00129687;
  }
  pcVar9 = config->upperConfig->protocolGatewayHostName;
  if (pcVar9 == (char *)0x0) {
    handle = STRING_construct(config->upperConfig->iotHubName);
    handleData->hostName = handle;
    if (handle != (STRING_HANDLE)0x0) {
      iVar2 = STRING_concat(handle,".");
      if ((iVar2 == 0) &&
         (iVar2 = STRING_concat(handle,config->upperConfig->iotHubSuffix), iVar2 == 0))
      goto LAB_001295e7;
      goto LAB_0012967a;
    }
  }
  else {
    handle = STRING_construct(pcVar9);
    handleData->hostName = handle;
    if (handle != (STRING_HANDLE)0x0) {
LAB_001295e7:
      pcVar9 = STRING_c_str(handle);
      pHVar5 = HTTPAPIEX_Create(pcVar9);
      handleData->httpApiExHandle = pHVar5;
      if (pHVar5 != (HTTPAPIEX_HANDLE)0x0) {
        pVVar6 = VECTOR_create(8);
        handleData->perDeviceList = pVVar6;
        if (pVVar6 != (VECTOR_HANDLE)0x0) {
          handleData->doBatchedTransfers = false;
          handleData->getMinimumPollingTime = 0x5dc;
          handleData->transport_ctx = ctx;
          pTVar8 = &handleData->transport_callbacks;
          for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
            pTVar8->msg_input_cb = cb_info->msg_input_cb;
            cb_info = (TRANSPORT_CALLBACKS_INFO *)((long)cb_info + (ulong)bVar10 * -0x10 + 8);
            pTVar8 = (TRANSPORT_CALLBACKS_INFO *)((long)pTVar8 + (ulong)bVar10 * -0x10 + 8);
          }
          return handleData;
        }
        destroy_httpApiExHandle(handleData);
      }
LAB_0012967a:
      destroy_hostName(handleData);
    }
  }
  HTTPAPIEX_Deinit();
LAB_00129687:
  free(handleData);
  return (TRANSPORT_LL_HANDLE)0x0;
}

Assistant:

static TRANSPORT_LL_HANDLE IoTHubTransportHttp_Create(const IOTHUBTRANSPORT_CONFIG* config, TRANSPORT_CALLBACKS_INFO* cb_info, void* ctx)
{
    HTTPTRANSPORT_HANDLE_DATA* result;
    if (config == NULL)
    {
        LogError("invalid arg (configuration is missing)");
        result = NULL;
    }
    else if (config->upperConfig == NULL)
    {
        LogError("invalid arg (upperConfig is NULL)");
        result = NULL;
    }
    else if (config->upperConfig->protocol == NULL)
    {
        LogError("invalid arg (protocol is NULL)");
        result = NULL;
    }
    else if (config->upperConfig->iotHubName == NULL)
    {
        LogError("invalid arg (iotHubName is NULL)");
        result = NULL;
    }
    else if (config->upperConfig->iotHubSuffix == NULL)
    {
        LogError("invalid arg (iotHubSuffix is NULL)");
        result = NULL;
    }
    else if (IoTHub_Transport_ValidateCallbacks(cb_info) != 0)
    {
        LogError("Invalid transport callback information");
        result = NULL;
    }
    else
    {
        result = (HTTPTRANSPORT_HANDLE_DATA*)malloc(sizeof(HTTPTRANSPORT_HANDLE_DATA));
        if (result == NULL)
        {
            LogError("unable to malloc");
        }
        else if (HTTPAPIEX_Init() == HTTPAPIEX_ERROR)
        {
            LogError("Error initializing HTTP");
            free(result);
            result = NULL;
        }
        else
        {
            bool was_hostName_ok = create_hostName(result, config);
            bool was_httpApiExHandle_ok = was_hostName_ok && create_httpApiExHandle(result, config);
            bool was_perDeviceList_ok = was_httpApiExHandle_ok && create_perDeviceList(result);

            if (was_perDeviceList_ok)
            {
                result->doBatchedTransfers = false;
                result->getMinimumPollingTime = DEFAULT_GETMINIMUMPOLLINGTIME;

                result->transport_ctx = ctx;
                memcpy(&result->transport_callbacks, cb_info, sizeof(TRANSPORT_CALLBACKS_INFO));
            }
            else
            {
                if (was_httpApiExHandle_ok) destroy_httpApiExHandle(result);
                if (was_hostName_ok) destroy_hostName(result);
                HTTPAPIEX_Deinit();

                free(result);
                result = NULL;
            }
        }
    }
    return result;
}